

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O3

size_t remove_trailing_zeroes(char *str)

{
  ushort **ppuVar1;
  size_t sVar2;
  char *__s;
  size_t sVar3;
  char cVar4;
  ulong uVar5;
  char *pcVar6;
  
  uVar5 = (ulong)(*str == '-');
  if (str[uVar5 + 3] == '.') {
    cVar4 = str[uVar5 + 4];
    __s = str + uVar5 + 4;
    if (cVar4 != '\0') {
      ppuVar1 = __ctype_b_loc();
      pcVar6 = (char *)0x0;
      do {
        if ((*(byte *)((long)*ppuVar1 + (long)cVar4 * 2 + 1) & 0x10) == 0) break;
        if (cVar4 != '0') {
          pcVar6 = __s;
        }
        cVar4 = __s[1];
        __s = __s + 1;
      } while (cVar4 != '\0');
      if (pcVar6 != (char *)0x0) {
        pcVar6 = pcVar6 + 1;
        if (pcVar6 != __s) {
          sVar2 = strlen(__s);
          memmove(pcVar6,__s,sVar2 + 1);
          return (long)__s - (long)pcVar6;
        }
        goto LAB_0010d444;
      }
    }
    sVar2 = strlen(__s);
    memmove(str + uVar5 + 3,__s,sVar2 + 1);
    sVar3 = (long)__s - (long)(str + uVar5 + 3);
  }
  else {
LAB_0010d444:
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

static size_t remove_trailing_zeroes(char* str)
{
    // [-]0xh.hhhh00000000p±d -> [-]0xh.hhhhp±d
    // [-]0xh.00000000p±d -> [-]0xh±d
    if (*str == '-') { ++str; }
    assert(*str == '0'); { ++str; }
    assert(*str == 'x'); { ++str; }
    assert(isxdigit(*str)); { ++str; }
    size_t removed = 0;
    if(*str == '.')
    {
        char* point = str;
        { ++str; }
        char* last_non_0 = NULL;
        for(; *str && isxdigit(*str); ++str)
        {
            if(*str != '0')
                last_non_0 = str;
        }
        assert(*str == 'p');
        if(last_non_0)
        {
            if(last_non_0 + 1 != str) {
                removed = str - (last_non_0 + 1);
                memmove(last_non_0 + 1, str, strlen(str)+1);
            }
        }
        else
        {
            memmove(point, str, strlen(str)+1);
            removed = str - point;
        }
    }
    else {
        assert(*str == 'p');
    }
    return removed;
}